

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall
smf::MidiMessage::makeSysExMessage
          (MidiMessage *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference puVar5;
  value_type_conflict2 local_71;
  uint local_70;
  int i;
  uchar local_59;
  iterator iStack_58;
  uchar item;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vlv;
  int msize;
  uint local_1c;
  int endindex;
  int startindex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  MidiMessage *this_local;
  
  local_1c = 0;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data);
  msize = (int)sVar2 + -1;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data);
  if (sVar3 != 0) {
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](data,0);
    local_1c = (uint)(*pvVar4 == 0xf0);
  }
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data);
  if ((sVar3 != 0) &&
     (pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back(data),
     *pvVar4 == 0xf7)) {
    msize = (int)sVar2 + -2;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,sVar2 + 7);
  vlv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0xf0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (value_type_conflict2 *)
             ((long)&vlv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  vlv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = (msize - local_1c) + 2;
  intToVlv((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1,
           (int)vlv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  __end1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
  iStack_58 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffa8), bVar1) {
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&__end1);
    local_59 = *puVar5;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_59);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&__end1);
  }
  for (local_70 = local_1c; (int)local_70 <= msize; local_70 = local_70 + 1) {
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (data,(long)(int)local_70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,pvVar4);
  }
  local_71 = 0xf7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_71);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
  return;
}

Assistant:

void MidiMessage::makeSysExMessage(const std::vector<uchar>& data) {
	int startindex = 0;
	int endindex = (int)data.size() - 1;
	if (data.size() > 0) {
		if (data[0] == 0xf0) {
			startindex++;
		}
	}
	if (data.size() > 0) {
		if (data.back() == 0xf7) {
			endindex--;
		}
	}

	this->clear();
	this->reserve(data.size() + 7);

	this->push_back((uchar)0xf0);

	int msize = endindex - startindex + 2;
	std::vector<uchar> vlv = intToVlv(msize);
	for (uchar item : vlv) {
		this->push_back(item);
	}
	for (int i=startindex; i<=endindex; i++) {
		this->push_back(data.at(i));
	}
	this->push_back((uchar)0xf7);
}